

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerExceptionManager::HandleInitializeRequest
          (cmDebuggerExceptionManager *this,CMakeInitializeResponse *response)

{
  bool bVar1;
  mapped_type *value;
  undefined1 local_118 [8];
  ExceptionBreakpointsFilter filter;
  pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter> *pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
  *__range1;
  array<dap::ExceptionBreakpointsFilter> exceptionBreakpointFilters;
  bool local_29;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  CMakeInitializeResponse *response_local;
  cmDebuggerExceptionManager *this_local;
  
  lock._8_8_ = response;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->Mutex);
  local_29 = true;
  dap::optional<dap::boolean>::operator=((optional<dap::boolean> *)(lock._8_8_ + 0x9e),&local_29);
  std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>::
  vector((vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
          *)&__range1);
  __end1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::begin(&this->ExceptionMap);
  pair = (pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter> *)
         std::
         unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
         ::end(&this->ExceptionMap);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_true>
                       ,(_Node_iterator_base<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_true>
                         *)&pair);
    if (!bVar1) break;
    filter._152_8_ =
         std::__detail::
         _Node_iterator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_false,_true>
         ::operator*(&__end1);
    dap::ExceptionBreakpointsFilter::ExceptionBreakpointsFilter
              ((ExceptionBreakpointsFilter *)local_118);
    std::__cxx11::string::operator=
              ((string *)&filter.description.set,(string *)(filter._152_8_ + 8));
    std::__cxx11::string::operator=
              ((string *)(filter.filter.field_2._M_local_buf + 8),(string *)(filter._152_8_ + 0x28))
    ;
    value = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ::operator[](&this->RaiseExceptions,(key_type *)&filter.description.set);
    dap::optional<dap::boolean>::operator=
              ((optional<dap::boolean> *)&filter.conditionDescription.set,value);
    std::vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>::
    emplace_back<dap::ExceptionBreakpointsFilter&>
              ((vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>
                *)&__range1,(ExceptionBreakpointsFilter *)local_118);
    dap::ExceptionBreakpointsFilter::~ExceptionBreakpointsFilter
              ((ExceptionBreakpointsFilter *)local_118);
    std::__detail::
    _Node_iterator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_false,_true>
    ::operator++(&__end1);
  }
  dap::
  optional<std::vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>>
  ::operator=((optional<std::vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>>
               *)(lock._8_8_ + 0x40),
              (vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
               *)&__range1);
  std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>::
  ~vector((vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
           *)&__range1);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void cmDebuggerExceptionManager::HandleInitializeRequest(
  dap::CMakeInitializeResponse& response)
{
  std::unique_lock<std::mutex> lock(Mutex);
  response.supportsExceptionInfoRequest = true;

  dap::array<dap::ExceptionBreakpointsFilter> exceptionBreakpointFilters;
  for (auto& pair : ExceptionMap) {
    dap::ExceptionBreakpointsFilter filter;
    filter.filter = pair.second.Filter;
    filter.label = pair.second.Label;
    filter.def = RaiseExceptions[filter.filter];
    exceptionBreakpointFilters.emplace_back(filter);
  }

  response.exceptionBreakpointFilters = exceptionBreakpointFilters;
}